

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

int gz_load(gz_statep state,uchar *buf,uint len,uint *have)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  char *msg;
  
  *have = 0;
  uVar2 = 0;
  do {
    sVar3 = read(state->fd,buf + uVar2,(ulong)(len - uVar2));
    iVar1 = (int)sVar3;
    if (iVar1 < 1) {
      if (-1 < iVar1) {
        state->eof = 1;
        return 0;
      }
      piVar4 = __errno_location();
      msg = strerror(*piVar4);
      gz_error(state,-1,msg);
      return -1;
    }
    uVar2 = iVar1 + *have;
    *have = uVar2;
  } while (uVar2 < len);
  return 0;
}

Assistant:

local int gz_load(gz_statep state, unsigned char *buf, unsigned len, unsigned *have)
{
    int ret;

    *have = 0;
    do {
        ret = read(state->fd, buf + *have, len - *have);
        if (ret <= 0)
            break;
        *have += ret;
    } while (*have < len);
    if (ret < 0) {
        gz_error(state, Z_ERRNO, zstrerror());
        return -1;
    }
    if (ret == 0)
        state->eof = 1;
    return 0;
}